

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resources.cpp
# Opt level: O2

uint64_t CaDiCaL::current_resident_set_size(void)

{
  __pid_t _Var1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  uint64_t uVar4;
  uint64_t rss;
  uint64_t dummy;
  char path [64];
  
  _Var1 = getpid();
  uVar4 = 0;
  snprintf(path,0x40,"/proc/%ld/statm",(long)_Var1);
  __stream = fopen(path,"r");
  if (__stream != (FILE *)0x0) {
    uVar4 = 0;
    iVar2 = __isoc99_fscanf(__stream,"%lu %lu",&dummy,&rss);
    fclose(__stream);
    if (iVar2 == 2) {
      lVar3 = sysconf(0x1e);
      uVar4 = lVar3 * rss;
    }
  }
  return uVar4;
}

Assistant:

uint64_t current_resident_set_size () {
  char path[64];
  snprintf (path, sizeof path, "/proc/%" PRId64 "/statm",
            (int64_t) getpid ());
  FILE *file = fopen (path, "r");
  if (!file)
    return 0;
  uint64_t dummy, rss;
  int scanned = fscanf (file, "%" PRIu64 " %" PRIu64 "", &dummy, &rss);
  fclose (file);
  return scanned == 2 ? rss * sysconf (_SC_PAGESIZE) : 0;
}